

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeNumberPrototype
               (DynamicObject *numberPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined8 in_RAX;
  uint uVar3;
  JavascriptMethod p_Var1;
  JavascriptFunction *pJVar2;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,numberPrototype,mode,8,0);
  this = (((numberPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(numberPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (numberPrototype,0x67,(this->super_JavascriptLibraryBase).numberConstructor.ptr,6,0,0,
             (ulong)uVar3 << 0x20);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptNumber::EntryInfo::ToExponential);
  pJVar2 = AddFunctionToLibraryObject
                     (this,numberPrototype,0x16c,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToExponential,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,pJVar2);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptNumber::EntryInfo::ToFixed)
  ;
  pJVar2 = AddFunctionToLibraryObject
                     (this,numberPrototype,0x16d,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToFixed,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,pJVar2);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptNumber::EntryInfo::ToPrecision);
  pJVar2 = AddFunctionToLibraryObject
                     (this,numberPrototype,0x176,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToPrecision,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,pJVar2);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptNumber::EntryInfo::ToLocaleString);
  pJVar2 = AddFunctionToLibraryObject
                     (this,numberPrototype,0x172,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToLocaleString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,pJVar2);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptNumber::EntryInfo::ToString);
  pJVar2 = AddFunctionToLibraryObject
                     (this,numberPrototype,0x178,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToString,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,pJVar2);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptNumber::EntryInfo::ValueOf)
  ;
  pJVar2 = AddFunctionToLibraryObject
                     (this,numberPrototype,0x18e,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ValueOf,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,pJVar2);
  DynamicObject::SetHasNoEnumerableProperties(numberPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeNumberPrototype(DynamicObject* numberPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(numberPrototype, mode, 8);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterNumber
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = numberPrototype->GetScriptContext();
        JavascriptLibrary* library = numberPrototype->GetLibrary();
        library->AddMember(numberPrototype, PropertyIds::constructor, library->numberConstructor);
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToExponential.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toExponential, &JavascriptNumber::EntryInfo::ToExponential, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToFixed.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toFixed, &JavascriptNumber::EntryInfo::ToFixed, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToPrecision.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toPrecision, &JavascriptNumber::EntryInfo::ToPrecision, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToLocaleString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toLocaleString, &JavascriptNumber::EntryInfo::ToLocaleString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toString, &JavascriptNumber::EntryInfo::ToString, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ValueOf.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::valueOf, &JavascriptNumber::EntryInfo::ValueOf, 0));

        numberPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }